

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O0

iterator_base<true> * __thiscall
pstore::index::
hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::iterator_base<true>::operator=(iterator_base<true> *this,iterator_base<true> *rhs)

{
  iterator_base<true> *rhs_local;
  iterator_base<true> *this_local;
  
  if (rhs != this) {
    if (this->db_ != rhs->db_) {
      __assert_fail("&db_ == &rhs.db_",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                    ,0x93,
                    "iterator_base<IsConstIterator> &pstore::index::hamt_map<std::basic_string<char>, pstore::index::details::empty_class>::iterator_base<>::operator=(iterator_base<IsConstIterator> &&) [KeyType = std::basic_string<char>, ValueType = pstore::index::details::empty_class, Hash = std::hash<string>, KeyEqual = std::equal_to<std::basic_string<char>>, IsConstIterator = true]"
                   );
    }
    memcpy(&this->visited_parents_,&rhs->visited_parents_,0xd8);
    this->index_ = rhs->index_;
    std::
    unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_>_>
    ::operator=(&this->pos_,&rhs->pos_);
  }
  return this;
}

Assistant:

iterator_base & operator= (iterator_base && rhs) noexcept {
                    if (&rhs != this) {
                        assert (&db_ == &rhs.db_);
                        visited_parents_ = std::move (rhs.visited_parents_);
                        index_ = rhs.index_;
                        pos_ = std::move (rhs.pos_);
                    }
                    return *this;
                }